

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_startmotion(_glist *x)

{
  int local_18;
  int local_14;
  int yval;
  int xval;
  _glist *x_local;
  
  if ((x->gl_editor != (t_editor *)0x0) &&
     ((_yval = x, glist_getnextxy(x,&local_14,&local_18), local_14 != 0 || (local_18 != 0)))) {
    _yval->gl_editor->field_0x88 = _yval->gl_editor->field_0x88 & 0xf8 | 1;
    _yval->gl_editor->e_xwas = local_14;
    _yval->gl_editor->e_ywas = local_18;
  }
  return;
}

Assistant:

void canvas_startmotion(t_canvas *x)
{
    int xval, yval;
    if (!x->gl_editor) return;
    glist_getnextxy(x, &xval, &yval);
    if (xval == 0 && yval == 0) return;
    x->gl_editor->e_onmotion = MA_MOVE;
    x->gl_editor->e_xwas = xval;
    x->gl_editor->e_ywas = yval;
}